

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

DlsMat NewDenseMat(sunindextype M,sunindextype N)

{
  void *pvVar1;
  long local_30;
  sunindextype j;
  DlsMat A;
  sunindextype N_local;
  sunindextype M_local;
  
  if ((M < 1) || (N < 1)) {
    M_local = 0;
  }
  else {
    M_local = (sunindextype)malloc(0x50);
    if ((undefined4 *)M_local == (undefined4 *)0x0) {
      M_local = 0;
    }
    else {
      pvVar1 = malloc(M * N * 8);
      *(void **)(M_local + 0x38) = pvVar1;
      if (*(long *)(M_local + 0x38) == 0) {
        free((void *)M_local);
        M_local = 0;
      }
      else {
        pvVar1 = malloc(N << 3);
        *(void **)(M_local + 0x48) = pvVar1;
        if (*(long *)(M_local + 0x48) == 0) {
          free(*(void **)(M_local + 0x38));
          *(undefined8 *)(M_local + 0x38) = 0;
          free((void *)M_local);
          M_local = 0;
        }
        else {
          for (local_30 = 0; local_30 < N; local_30 = local_30 + 1) {
            *(long *)(*(long *)(M_local + 0x48) + local_30 * 8) =
                 *(long *)(M_local + 0x38) + local_30 * M * 8;
          }
          *(sunindextype *)(M_local + 8) = M;
          *(sunindextype *)(M_local + 0x10) = N;
          *(sunindextype *)(M_local + 0x18) = M;
          *(sunindextype *)(M_local + 0x40) = M * N;
          *(undefined4 *)M_local = 1;
        }
      }
    }
  }
  return (DlsMat)M_local;
}

Assistant:

DlsMat NewDenseMat(sunindextype M, sunindextype N)
{
  DlsMat A;
  sunindextype j;

  if ( (M <= 0) || (N <= 0) ) return(NULL);

  A = NULL;
  A = (DlsMat) malloc(sizeof *A);
  if (A==NULL) return (NULL);
  
  A->data = (realtype *) malloc(M * N * sizeof(realtype));
  if (A->data == NULL) {
    free(A); A = NULL;
    return(NULL);
  }
  A->cols = (realtype **) malloc(N * sizeof(realtype *));
  if (A->cols == NULL) {
    free(A->data); A->data = NULL;
    free(A); A = NULL;
    return(NULL);
  }

  for (j=0; j < N; j++) A->cols[j] = A->data + j * M;

  A->M = M;
  A->N = N;
  A->ldim = M;
  A->ldata = M*N;

  A->type = SUNDIALS_DENSE;

  return(A);
}